

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_type_create_resized_
               (MPIABI_Fint *oldtype,MPIABI_Fint *lb,MPIABI_Fint *extent,MPIABI_Fint *newtype,
               MPIABI_Fint *ierror)

{
  mpi_type_create_resized_();
  return;
}

Assistant:

void mpiabi_type_create_resized_(
  const MPIABI_Fint * oldtype,
  const MPIABI_Fint * lb,
  const MPIABI_Fint * extent,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_create_resized_(
    oldtype,
    lb,
    extent,
    newtype,
    ierror
  );
}